

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_addmul_v_s256_30_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  block_t *Ablock;
  block_t *vblock;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  
  auVar1 = vpmovsxbq_avx(ZEXT216(0x3c3d));
  auVar14 = vpmovsxbq_avx(ZEXT216(0x3a3b));
  auVar2 = vpmovsxbq_avx(ZEXT216(0x3839));
  lVar7 = 0x40;
  auVar8 = vpbroadcastq_avx512vl();
  auVar9 = vpsllvq_avx2(auVar8,_DAT_00180bb0);
  auVar9 = vpsraq_avx512vl(auVar9,0x3f);
  auVar17 = vpermq_avx2(ZEXT1632(auVar9),0x50);
  auVar15 = vpternlogq_avx512vl(auVar17,ZEXT1632(*(undefined1 (*) [16])c->w64),
                                *(undefined1 (*) [32])A->w64,0x6c);
  auVar9 = vpsllvq_avx2(auVar8,_DAT_00180bc0);
  auVar8._8_8_ = 0x8080808003020100;
  auVar8._0_8_ = 0x8080808003020100;
  auVar9 = vpsraq_avx512vl(auVar9,0x3f);
  auVar17 = vpermq_avx2(ZEXT1632(auVar9),0x50);
  auVar17 = vpand_avx2(auVar17,*(undefined1 (*) [32])A[1].w64);
  uVar5 = v->w64[1] >> 0x26;
  do {
    uVar6 = uVar5;
    auVar10 = vpbroadcastq_avx512vl();
    auVar11 = vpbroadcastq_avx512vl();
    auVar4 = vpsllvq_avx2(auVar10,auVar1);
    auVar13 = vpsllvq_avx2(auVar10,auVar14);
    auVar9 = vpshufb_avx(ZEXT416((uint)uVar6 & 1),auVar8);
    auVar11 = vpsraq_avx512vl(auVar11,0x3f);
    auVar12 = vpsraq_avx512vl(auVar4,0x3f);
    auVar13 = vpsraq_avx512vl(auVar13,0x3f);
    auVar4 = vpshufd_avx(auVar11,0xee);
    auVar16 = vpermq_avx2(ZEXT1632(auVar12),0x50);
    auVar3 = vpermq_avx2(ZEXT1632(auVar13),0x50);
    auVar9 = vpsubq_avx((undefined1  [16])0x0,auVar9);
    auVar16 = vpternlogq_avx512vl(auVar17,auVar16,*(undefined1 (*) [32])((long)A[1].w64 + lVar7),
                                  0x78);
    auVar17._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar9;
    auVar17._16_16_ = ZEXT116(1) * auVar4;
    auVar17 = vpternlogq_avx512vl(auVar15,auVar17,*(undefined1 (*) [32])((long)A->w64 + lVar7),0x78)
    ;
    auVar9 = vpsllvq_avx2(auVar10,auVar2);
    auVar9 = vpsraq_avx512vl(auVar9,0x3f);
    auVar15 = vpternlogq_avx512vl(auVar17,auVar3,*(undefined1 (*) [32])((long)A[2].w64 + lVar7),0x78
                                 );
    auVar17 = vpermq_avx2(ZEXT1632(auVar9),0x50);
    auVar17 = vpternlogq_avx512vl(auVar16,auVar17,*(undefined1 (*) [32])((long)A[3].w64 + lVar7),
                                  0x78);
    lVar7 = lVar7 + 0x80;
    uVar5 = uVar6 >> 8;
  } while ((int)lVar7 != 0x1c0);
  auVar1 = vpshufb_avx(ZEXT416((uint)(uVar6 >> 8) & 1),_DAT_00180b70);
  auVar14 = vpbroadcastq_avx512vl();
  auVar14 = vpsraq_avx512vl(auVar14,0x3f);
  auVar14 = vpshufd_avx(auVar14,0xee);
  auVar1 = vpsubq_avx((undefined1  [16])0x0,auVar1);
  auVar16._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar1;
  auVar16._16_16_ = ZEXT116(1) * auVar14;
  auVar16 = vpand_avx2(auVar16,*(undefined1 (*) [32])A[0xe].w64);
  auVar17 = vpternlogq_avx512vl(auVar15,auVar17,auVar16,0x96);
  *(undefined1 (*) [16])c->w64 = auVar17._0_16_ ^ auVar17._16_16_;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_addmul_v_s256_30_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);
  word idx              = vblock->w64[1] >> 34;

  word256 cval[2];
  cval[0] = mm256_xor_mask(_mm256_setr_m128i(mm128_load(cblock->w64), mm128_zero),
                           mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
  cval[1] = mm256_and(mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
  idx >>= 4;
  Ablock += 2;

  for (unsigned int i = 24; i; i -= 8, idx >>= 8, Ablock += 4) {
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask_2(idx, 4));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask_2(idx, 6));
  }
  cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));

  cval[0] = mm256_xor(cval[0], cval[1]);
  mm128_store(cblock->w64, mm128_xor(_mm256_extractf128_si256(cval[0], 0),
                                     _mm256_extractf128_si256(cval[0], 1)));
}